

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

StreamExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StreamExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::StreamExpressionWithRangeSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,StreamExpressionWithRangeSyntax **args_1)

{
  StreamExpressionWithRangeSyntax *pSVar1;
  StreamExpressionSyntax *pSVar2;
  
  pSVar2 = (StreamExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StreamExpressionSyntax *)this->endPtr < pSVar2 + 1) {
    pSVar2 = (StreamExpressionSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pSVar2 + 1);
  }
  pSVar1 = *args_1;
  (pSVar2->super_SyntaxNode).kind = StreamExpression;
  (pSVar2->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pSVar2->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pSVar2->expression).ptr = args;
  pSVar2->withRange = pSVar1;
  (args->super_SyntaxNode).parent = &pSVar2->super_SyntaxNode;
  if (pSVar1 != (StreamExpressionWithRangeSyntax *)0x0) {
    (pSVar1->super_SyntaxNode).parent = &pSVar2->super_SyntaxNode;
  }
  return pSVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }